

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directional_light.cpp
# Opt level: O2

Light_SampleRes *
embree::DirectionalLight_sample
          (Light_SampleRes *__return_storage_ptr__,Light *super,DifferentialGeometry *dg,Vec2f *s)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  float local_28;
  float fStack_24;
  float fStack_20;
  
  uVar10 = *(undefined8 *)(super + 0xe);
  *(undefined8 *)&(__return_storage_ptr__->dir).field_0 = *(undefined8 *)(super + 0xc);
  *(undefined8 *)((long)&(__return_storage_ptr__->dir).field_0 + 8) = uVar10;
  __return_storage_ptr__->dist = INFINITY;
  __return_storage_ptr__->pdf = (float)super[0x15].type;
  if ((float)super[0x14].type < 0.9999999) {
    uniformSampleCone((embree *)&local_28,(float)super[0x14].type,s);
    fVar1 = (float)super[0xd].type;
    fVar2 = (float)super[0xe].type;
    fVar3 = (float)super[0xf].type;
    fVar4 = (float)super[9].type;
    fVar5 = (float)super[10].type;
    fVar6 = (float)super[0xb].type;
    fVar7 = (float)super[5].type;
    fVar8 = (float)super[6].type;
    fVar9 = (float)super[7].type;
    (__return_storage_ptr__->dir).field_0.m128[0] =
         local_28 * (float)super[4].type +
         fStack_24 * (float)super[8].type + fStack_20 * (float)super[0xc].type;
    (__return_storage_ptr__->dir).field_0.m128[1] =
         local_28 * fVar7 + fStack_24 * fVar4 + fStack_20 * fVar1;
    (__return_storage_ptr__->dir).field_0.m128[2] =
         local_28 * fVar8 + fStack_24 * fVar5 + fStack_20 * fVar2;
    (__return_storage_ptr__->dir).field_0.m128[3] =
         local_28 * fVar9 + fStack_24 * fVar6 + fStack_20 * fVar3;
  }
  uVar10 = *(undefined8 *)(super + 0x12);
  *(undefined8 *)&(__return_storage_ptr__->weight).field_0 = *(undefined8 *)(super + 0x10);
  *(undefined8 *)((long)&(__return_storage_ptr__->weight).field_0 + 8) = uVar10;
  return __return_storage_ptr__;
}

Assistant:

SYCL_EXTERNAL Light_SampleRes DirectionalLight_sample(const Light* super,
                                                                     const DifferentialGeometry& dg,
                                                                     const Vec2f& s)
{
  const DirectionalLight* self = (DirectionalLight*)super;
  Light_SampleRes res;

  res.dir = self->frame.vz;
  res.dist = inf;
  res.pdf = self->pdf;

  if (self->cosAngle < COS_ANGLE_MAX)
    res.dir = self->frame * uniformSampleCone(self->cosAngle, s);

  res.weight = self->radiance; // *pdf/pdf cancel

  return res;
}